

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_ranges.c
# Opt level: O0

int dwarf_get_ranges_b(Dwarf_Debug dbg,Dwarf_Off rangesoffset,Dwarf_Die die,Dwarf_Off *actual_offset
                      ,Dwarf_Ranges **rangesbuf,Dwarf_Signed *listlen,Dwarf_Unsigned *bytecount,
                      Dwarf_Error *error)

{
  Dwarf_Off DVar1;
  char *pcVar2;
  long lVar3;
  undefined1 local_120 [8];
  dwarfstring m_2;
  ranges_entry *re;
  dwarfstring m_1;
  dwarfstring m;
  Dwarf_CU_Context_conflict cucontext;
  Dwarf_Half offset_size;
  Dwarf_Error pDStack_a8;
  Dwarf_Half die_version;
  Dwarf_Error localerror;
  Dwarf_Debug localdbg;
  Dwarf_Unsigned ranges_base;
  ushort local_86;
  int res;
  Dwarf_Half address_size;
  Dwarf_Addr *pDStack_80;
  uint copyindex;
  Dwarf_Ranges *ranges_data_out;
  ranges_entry *curre;
  ranges_entry *last;
  ranges_entry *base;
  Dwarf_Small *pDStack_58;
  uint entry_count;
  Dwarf_Small *section_end;
  Dwarf_Small *beginrangeptr;
  Dwarf_Small *rangeptr;
  Dwarf_Signed *listlen_local;
  Dwarf_Ranges **rangesbuf_local;
  Dwarf_Off *actual_offset_local;
  Dwarf_Die die_local;
  Dwarf_Off rangesoffset_local;
  Dwarf_Debug dbg_local;
  
  beginrangeptr = (Dwarf_Small *)0x0;
  section_end = (Dwarf_Small *)0x0;
  pDStack_58 = (Dwarf_Small *)0x0;
  base._4_4_ = 0;
  last = (ranges_entry *)0x0;
  curre = (ranges_entry *)0x0;
  ranges_data_out = (Dwarf_Ranges *)0x0;
  pDStack_80 = (Dwarf_Addr *)0x0;
  res = 0;
  local_86 = 0;
  ranges_base._4_4_ = 1;
  localdbg = (Dwarf_Debug)0x0;
  pDStack_a8 = (Dwarf_Error)0x0;
  cucontext._6_2_ = 3;
  cucontext._4_2_ = 4;
  localerror = (Dwarf_Error)dbg;
  rangeptr = (Dwarf_Small *)listlen;
  listlen_local = (Dwarf_Signed *)rangesbuf;
  rangesbuf_local = (Dwarf_Ranges **)actual_offset;
  actual_offset_local = (Dwarf_Off *)die;
  die_local = (Dwarf_Die)rangesoffset;
  rangesoffset_local = (Dwarf_Off)dbg;
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                        "DW_DLE_DBG_NULL: dbg argument to dwarf_get_ranges_b()either null or it containsa stale Dwarf_Debug pointer"
                       );
    return 1;
  }
  local_86 = (ushort)dbg->de_pointer_size;
  if (die != (Dwarf_Die)0x0) {
    ranges_base._4_4_ =
         dwarf_get_version_of_die
                   (die,(Dwarf_Half *)((long)&cucontext + 6),(Dwarf_Half *)((long)&cucontext + 4));
    if (ranges_base._4_4_ == 1) {
      _dwarf_error((Dwarf_Debug)rangesoffset_local,error,0x68);
      return 1;
    }
    if (actual_offset_local[2] == 0) {
      _dwarf_error((Dwarf_Debug)rangesoffset_local,error,0x68);
      return 1;
    }
    DVar1 = actual_offset_local[2];
    if (*(short *)(DVar1 + 0x264) != 4) {
      localdbg = *(Dwarf_Debug *)(DVar1 + 0x1f8);
    }
    die_local = (Dwarf_Die)((long)&die_local->di_debug_ptr + (long)&localdbg->de_magic);
    local_86 = (ushort)*(byte *)(DVar1 + 0x20);
  }
  localerror = (Dwarf_Error)rangesoffset_local;
  ranges_base._4_4_ =
       _dwarf_load_section((Dwarf_Debug)rangesoffset_local,
                           (Dwarf_Section_s *)(rangesoffset_local + 0x13f8),error);
  if (ranges_base._4_4_ == 1) {
    return 1;
  }
  if (ranges_base._4_4_ == -1) {
    localerror = *(Dwarf_Error *)(rangesoffset_local + 0x25f0);
    if ((Dwarf_Debug)localerror == (Dwarf_Debug)0x0) {
      return -1;
    }
    ranges_base._4_4_ =
         _dwarf_load_section((Dwarf_Debug)localerror,&((Dwarf_Debug)localerror)->de_debug_ranges,
                             &stack0xffffffffffffff58);
    if (ranges_base._4_4_ == 1) {
      _dwarf_error_mv_s_to_t
                ((Dwarf_Debug)localerror,&stack0xffffffffffffff58,(Dwarf_Debug)rangesoffset_local,
                 error);
      return ranges_base._4_4_;
    }
    if (ranges_base._4_4_ == -1) {
      return -1;
    }
  }
  if (die_local < (Dwarf_Die)localerror[0xd5].er_msg) {
    if (localdbg < (Dwarf_Debug)localerror[0xd5].er_msg) {
      if (die_local < (Dwarf_Die)localerror[0xd5].er_msg) {
        pDStack_58 = (Dwarf_Small *)(localerror[0xd5].er_errval + (long)localerror[0xd5].er_msg);
        section_end = (Dwarf_Small *)((long)&die_local->di_debug_ptr + localerror[0xd5].er_errval);
        beginrangeptr = section_end;
        while (m_2.s_malloc = '\0', m_2._25_7_ = 0, beginrangeptr != pDStack_58) {
          if (pDStack_58 < beginrangeptr) {
            free_allocated_ranges(last);
            dwarfstring_constructor((dwarfstring_s *)local_120);
            dwarfstring_append((dwarfstring_s *)local_120,
                               "DW_DLE_DEBUG_RANGES_OFFSET_BAD:  ranges pointer ran off the end of the  section"
                              );
            DVar1 = rangesoffset_local;
            pcVar2 = dwarfstring_string((dwarfstring_s *)local_120);
            _dwarf_error_string((Dwarf_Debug)DVar1,error,0xce,pcVar2);
            dwarfstring_destructor((dwarfstring_s *)local_120);
            return 1;
          }
          m_2._24_8_ = calloc(1,0x20);
          if ((void *)m_2._24_8_ == (void *)0x0) {
            free_allocated_ranges(last);
            _dwarf_error((Dwarf_Debug)rangesoffset_local,error,0xd0);
            return 1;
          }
          if (pDStack_58 < beginrangeptr + (int)((uint)local_86 << 1)) {
            free((void *)m_2._24_8_);
            free_allocated_ranges(last);
            _dwarf_error_string((Dwarf_Debug)rangesoffset_local,error,0xce,
                                "DW_DLE_DEBUG_RANGES_OFFSET_BAD:  Not at the end of the ranges section  but there is not enough room in the section  for the next ranges entry"
                               );
            return 1;
          }
          base._4_4_ = base._4_4_ + 1;
          ranges_base._4_4_ =
               read_unaligned_addr_check
                         ((Dwarf_Debug)localerror,(Dwarf_Addr *)(m_2._24_8_ + 8),beginrangeptr,
                          (uint)local_86,error,pDStack_58);
          if (ranges_base._4_4_ != 0) {
            free((void *)m_2._24_8_);
            free_allocated_ranges(last);
            return ranges_base._4_4_;
          }
          beginrangeptr = beginrangeptr + (int)(uint)local_86;
          ranges_base._4_4_ =
               read_unaligned_addr_check
                         ((Dwarf_Debug)localerror,(Dwarf_Addr *)(m_2._24_8_ + 0x10),beginrangeptr,
                          (uint)local_86,error,pDStack_58);
          if (ranges_base._4_4_ != 0) {
            free((void *)m_2._24_8_);
            free_allocated_ranges(last);
            return ranges_base._4_4_;
          }
          beginrangeptr = beginrangeptr + (int)(uint)local_86;
          if (last == (ranges_entry *)0x0) {
            last = (ranges_entry *)m_2._24_8_;
          }
          else {
            curre->next = (ranges_entry *)m_2._24_8_;
          }
          curre = (ranges_entry *)m_2._24_8_;
          ranges_base._4_4_ = 0;
          if ((*(long *)(m_2._24_8_ + 8) == 0) && (*(long *)(m_2._24_8_ + 0x10) == 0)) {
            *(undefined4 *)(m_2._24_8_ + 0x18) = 2;
            break;
          }
          lVar3 = 0xffffffff;
          if (local_86 == 8) {
            lVar3 = -1;
          }
          if (*(long *)(m_2._24_8_ + 8) == lVar3) {
            *(undefined4 *)(m_2._24_8_ + 0x18) = 1;
          }
          else {
            *(undefined4 *)(m_2._24_8_ + 0x18) = 0;
          }
        }
        pDStack_80 = (Dwarf_Addr *)
                     _dwarf_get_alloc((Dwarf_Debug)rangesoffset_local,'\x1d',(ulong)base._4_4_);
        if (pDStack_80 == (Dwarf_Addr *)0x0) {
          free_allocated_ranges(last);
          _dwarf_error((Dwarf_Debug)rangesoffset_local,error,0xd0);
          dbg_local._4_4_ = 1;
        }
        else {
          ranges_data_out = (Dwarf_Ranges *)last;
          *listlen_local = (Dwarf_Signed)pDStack_80;
          *(ulong *)rangeptr = (ulong)base._4_4_;
          res = 0;
          for (; ranges_data_out != (Dwarf_Ranges *)0x0 && (uint)res < base._4_4_;
              ranges_data_out = (Dwarf_Ranges *)ranges_data_out->dwr_addr1) {
            *pDStack_80 = ranges_data_out->dwr_addr2;
            pDStack_80[1] = *(Dwarf_Addr *)&ranges_data_out->dwr_type;
            pDStack_80[2] = ranges_data_out[1].dwr_addr1;
            res = res + 1;
            pDStack_80 = pDStack_80 + 3;
          }
          free_allocated_ranges(last);
          if (rangesbuf_local != (Dwarf_Ranges **)0x0) {
            *rangesbuf_local = (Dwarf_Ranges *)die_local;
          }
          if (bytecount != (Dwarf_Unsigned *)0x0) {
            *bytecount = (long)beginrangeptr - (long)section_end;
          }
          dbg_local._4_4_ = 0;
        }
      }
      else {
        dwarfstring_constructor((dwarfstring_s *)&re);
        dwarfstring_append_printf_u
                  ((dwarfstring *)&re,
                   "DW_DLE_DEBUG_RANGES_OFFSET_BAD:  ranges base+offset  is 0x%lx ",
                   (long)&die_local->di_debug_ptr + (long)&localdbg->de_magic);
        dwarfstring_append_printf_u
                  ((dwarfstring *)&re," and section size is 0x%lx.",
                   (dwarfstring_u)localerror[0xd5].er_msg);
        DVar1 = rangesoffset_local;
        pcVar2 = dwarfstring_string((dwarfstring_s *)&re);
        _dwarf_error_string((Dwarf_Debug)DVar1,error,0xce,pcVar2);
        dwarfstring_destructor((dwarfstring_s *)&re);
        dbg_local._4_4_ = 1;
      }
    }
    else {
      dwarfstring_constructor((dwarfstring_s *)&m_1.s_malloc);
      dwarfstring_append_printf_u
                ((dwarfstring *)&m_1.s_malloc,
                 "DW_DLE_DEBUG_RANGES_OFFSET_BAD:  ranges base is 0x%lx ",(dwarfstring_u)localdbg);
      dwarfstring_append_printf_u
                ((dwarfstring *)&m_1.s_malloc," and section size is 0x%lx.",
                 (dwarfstring_u)localerror[0xd5].er_msg);
      DVar1 = rangesoffset_local;
      pcVar2 = dwarfstring_string((dwarfstring_s *)&m_1.s_malloc);
      _dwarf_error_string((Dwarf_Debug)DVar1,error,0xce,pcVar2);
      dwarfstring_destructor((dwarfstring_s *)&m_1.s_malloc);
      dbg_local._4_4_ = 1;
    }
  }
  else {
    dbg_local._4_4_ = -1;
  }
  return dbg_local._4_4_;
}

Assistant:

int dwarf_get_ranges_b(Dwarf_Debug dbg,
    Dwarf_Off rangesoffset,
    Dwarf_Die die,
    Dwarf_Off *actual_offset /* in .debug_ranges */,
    Dwarf_Ranges ** rangesbuf,
    Dwarf_Signed * listlen,
    Dwarf_Unsigned * bytecount,
    Dwarf_Error * error)
{
    Dwarf_Small *rangeptr = 0;
    Dwarf_Small *beginrangeptr = 0;
    Dwarf_Small *section_end = 0;
    unsigned entry_count = 0;
    struct ranges_entry *base = 0;
    struct ranges_entry *last = 0;
    struct ranges_entry *curre = 0;
    Dwarf_Ranges * ranges_data_out = 0;
    unsigned copyindex = 0;
    Dwarf_Half address_size = 0;
    int res = DW_DLV_ERROR;
    Dwarf_Unsigned ranges_base = 0;
    Dwarf_Debug    localdbg = dbg;
    Dwarf_Error    localerror = 0;

    /* default for dwarf_get_ranges() */
    Dwarf_Half     die_version = 3;

    Dwarf_Half offset_size= 4;
    Dwarf_CU_Context cucontext = 0;

    CHECK_DBG(dbg,error,"dwarf_get_ranges_b()");
    address_size = localdbg->de_pointer_size; /* default  */
    if (die) {
        /*  printing by raw offset from DW_AT_ranges attribute.
            If we wind up using the tied file the die_version
            had better match! It cannot be other than a match.
            Can return DW_DLV_ERROR, not DW_DLV_NO_ENTRY.
            Add err code if error.  Version comes from the
            cu context, not the DIE itself. */
        res = dwarf_get_version_of_die(die,&die_version,
            &offset_size);
        if (res == DW_DLV_ERROR) {
            _dwarf_error(dbg, error, DW_DLE_DIE_NO_CU_CONTEXT);
            return DW_DLV_ERROR;
        }
        if (!die->di_cu_context) {
            _dwarf_error(dbg, error, DW_DLE_DIE_NO_CU_CONTEXT);
            return DW_DLV_ERROR;
        }
        cucontext = die->di_cu_context;
        /*  The DW4 ranges base was never used in GNU
            but did get emitted, the note says, but
            the note is probably obsolete (so, now wrong).
            http://llvm.1065342.n5.nabble.com/DebugInfo\
            -DW-AT-GNU-ranges-base-in-non-fission-\
            td64194.html
            HOWEVER: in dw4 GNU fission extension
            it is used and matters.
            */
        /*  ranges_base was merged from tied context.
            Otherwise it is zero. But not if
            the current die is the skeleton */
        if (cucontext->cc_unit_type != DW_UT_skeleton) {
            ranges_base = cucontext->cc_ranges_base;
        }
        rangesoffset += ranges_base;
        address_size = cucontext->cc_address_size;
    } else {
        /*  Printing by raw offset
            The caller will use the bytecount to
            increment to the next part of .debug_ranges
            and will call again with the next offset */
    }

    localdbg = dbg;
    res = _dwarf_load_section(localdbg, &localdbg->de_debug_ranges,
        error);
    if (res == DW_DLV_ERROR) {
        return res;
    }
    if (res == DW_DLV_NO_ENTRY) {
        /* data is in a.out, not dwp */
        localdbg = dbg->de_tied_data.td_tied_object;
        if (!localdbg) {
            return DW_DLV_NO_ENTRY;
        }
        res = _dwarf_load_section(localdbg,
            &localdbg->de_debug_ranges, &localerror);
        if (res == DW_DLV_ERROR) {
            _dwarf_error_mv_s_to_t(localdbg,&localerror,dbg,error);
            return res;
        }
        if (res == DW_DLV_NO_ENTRY) {
            return res;
        }
    }

    /*  Be safe in case adding rangesoffset and rangebase
        overflows. */
    if (rangesoffset  >= localdbg->de_debug_ranges.dss_size) {
        /* Documented behavior in libdwarf2.1.mm */
        return DW_DLV_NO_ENTRY;
    }
    if (ranges_base >= localdbg->de_debug_ranges.dss_size) {
        dwarfstring m;

        dwarfstring_constructor(&m);
        dwarfstring_append_printf_u(&m,
            "DW_DLE_DEBUG_RANGES_OFFSET_BAD: "
            " ranges base is 0x%lx ",ranges_base);
        dwarfstring_append_printf_u(&m,
            " and section size is 0x%lx.",
            localdbg->de_debug_ranges.dss_size);
        _dwarf_error_string(dbg, error,
            DW_DLE_DEBUG_RANGES_OFFSET_BAD,
            dwarfstring_string(&m));
        dwarfstring_destructor(&m);
        return DW_DLV_ERROR;
    }
    if (rangesoffset >= localdbg->de_debug_ranges.dss_size) {
        dwarfstring m;

        dwarfstring_constructor(&m);
        dwarfstring_append_printf_u(&m,
            "DW_DLE_DEBUG_RANGES_OFFSET_BAD: "
            " ranges base+offset  is 0x%lx ",
            ranges_base+rangesoffset);
        dwarfstring_append_printf_u(&m,
            " and section size is 0x%lx.",
            localdbg->de_debug_ranges.dss_size);
        _dwarf_error_string(dbg, error,
            DW_DLE_DEBUG_RANGES_OFFSET_BAD,
            dwarfstring_string(&m));
        dwarfstring_destructor(&m);
        return DW_DLV_ERROR;
    }

    /*  tied address_size must match the dwo address_size */
    section_end = localdbg->de_debug_ranges.dss_data +
        localdbg->de_debug_ranges.dss_size;
    rangeptr = localdbg->de_debug_ranges.dss_data;
#if 0
    if (!rangeslocal) {
        /* printing ranges where range source is dwp,
            here we just assume present. */
    }
#endif
    rangeptr += rangesoffset;
    beginrangeptr = rangeptr;

    for (;;) {
        struct ranges_entry * re = 0;

        if (rangeptr == section_end) {
            break;
        }
        if (rangeptr  > section_end) {
            dwarfstring m;

            free_allocated_ranges(base);
            dwarfstring_constructor(&m);
            dwarfstring_append(&m,
                "DW_DLE_DEBUG_RANGES_OFFSET_BAD: "
                " ranges pointer ran off the end "
                "of the  section");
            _dwarf_error_string(dbg, error,
                DW_DLE_DEBUG_RANGES_OFFSET_BAD,
                dwarfstring_string(&m));
            dwarfstring_destructor(&m);
            return DW_DLV_ERROR;
        }
        re = calloc(1, sizeof(struct ranges_entry));
        if (!re) {
            free_allocated_ranges(base);
            _dwarf_error(dbg, error, DW_DLE_DEBUG_RANGES_OUT_OF_MEM);
            return DW_DLV_ERROR;
        }
        if ((rangeptr + (2*address_size)) > section_end) {
            free(re);
            free_allocated_ranges(base);
            _dwarf_error_string(dbg, error,
                DW_DLE_DEBUG_RANGES_OFFSET_BAD,
                "DW_DLE_DEBUG_RANGES_OFFSET_BAD: "
                " Not at the end of the ranges section "
                " but there is not enough room in the section "
                " for the next ranges entry");
            return  DW_DLV_ERROR;
        }
        entry_count++;
        res = read_unaligned_addr_check(localdbg,&re->cur.dwr_addr1,
            rangeptr, address_size,error,section_end);
        if (res != DW_DLV_OK) {
            free(re);
            free_allocated_ranges(base);
            return res;
        }
        rangeptr +=  address_size;
        res = read_unaligned_addr_check(localdbg,&re->cur.dwr_addr2,
            rangeptr, address_size,error,section_end);
        if (res != DW_DLV_OK) {
            free(re);
            free_allocated_ranges(base);
            return res;
        }
        rangeptr +=  address_size;
        if (!base) {
            base = re;
            last = re;
        } else {
            last->next = re;
            last = re;
        }
        if (re->cur.dwr_addr1 == 0 && re->cur.dwr_addr2 == 0) {
            re->cur.dwr_type =  DW_RANGES_END;
            break;
        } else if (re->cur.dwr_addr1 == MAX_ADDR) {
            re->cur.dwr_type =  DW_RANGES_ADDRESS_SELECTION;
        } else {
            re->cur.dwr_type =  DW_RANGES_ENTRY;
        }
    }

    /* We return ranges on dbg, so use that to allocate. */
    ranges_data_out =   (Dwarf_Ranges *)
        _dwarf_get_alloc(dbg,DW_DLA_RANGES,entry_count);
    if (!ranges_data_out) {
        /* Error, apply to original, not local dbg. */
        free_allocated_ranges(base);
        _dwarf_error(dbg, error, DW_DLE_DEBUG_RANGES_OUT_OF_MEM);
        return DW_DLV_ERROR;
    }
    curre = base;
    *rangesbuf = ranges_data_out;
    *listlen = entry_count;
    for (copyindex = 0; curre && (copyindex < entry_count);
        ++copyindex,++ranges_data_out,curre=curre->next) {
        *ranges_data_out = curre->cur;
    }
    /* ASSERT: curre == NULL */
    free_allocated_ranges(base);
    base = 0;
    /* Callers will often not care about the bytes used. */
    if (actual_offset) {
        *actual_offset = rangesoffset;
    }
    if (bytecount) {
        *bytecount = rangeptr - beginrangeptr;
    }
    return DW_DLV_OK;
}